

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

StructuredAssignmentPatternExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::StructuredAssignmentPatternExpression,slang::ast::Type_const&,nonstd::span_lite::span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,18446744073709551615ul>,nonstd::span_lite::span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,18446744073709551615ul>,nonstd::span_lite::span<slang::ast::StructuredAssignmentPatternExpression::IndexSetter_const,18446744073709551615ul>,slang::ast::Expression_const*&,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
          (BumpAllocator *this,Type *args,
          span<slang::ast::StructuredAssignmentPatternExpression::MemberSetter,_18446744073709551615UL>
          *args_1,span<slang::ast::StructuredAssignmentPatternExpression::TypeSetter,_18446744073709551615UL>
                  *args_2,
          span<const_slang::ast::StructuredAssignmentPatternExpression::IndexSetter,_18446744073709551615UL>
          *args_3,Expression **args_4,
          span<const_slang::ast::Expression_*,_18446744073709551615UL> *args_5,SourceRange *args_6)

{
  Expression *pEVar1;
  pointer pMVar2;
  size_type sVar3;
  pointer pTVar4;
  size_type sVar5;
  pointer pIVar6;
  size_type sVar7;
  pointer ppEVar8;
  size_type sVar9;
  SourceLocation SVar10;
  SourceLocation SVar11;
  StructuredAssignmentPatternExpression *pSVar12;
  
  pSVar12 = (StructuredAssignmentPatternExpression *)
            ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((StructuredAssignmentPatternExpression *)this->endPtr < pSVar12 + 1) {
    pSVar12 = (StructuredAssignmentPatternExpression *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(pSVar12 + 1);
  }
  pMVar2 = args_1->data_;
  sVar3 = args_1->size_;
  pTVar4 = args_2->data_;
  sVar5 = args_2->size_;
  pIVar6 = args_3->data_;
  sVar7 = args_3->size_;
  pEVar1 = *args_4;
  ppEVar8 = args_5->data_;
  sVar9 = args_5->size_;
  SVar10 = args_6->startLoc;
  SVar11 = args_6->endLoc;
  (pSVar12->super_AssignmentPatternExpressionBase).super_Expression.kind =
       StructuredAssignmentPattern;
  (pSVar12->super_AssignmentPatternExpressionBase).super_Expression.type.ptr = args;
  (pSVar12->super_AssignmentPatternExpressionBase).super_Expression.constant = (ConstantValue *)0x0;
  (pSVar12->super_AssignmentPatternExpressionBase).super_Expression.syntax = (ExpressionSyntax *)0x0
  ;
  (pSVar12->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.startLoc = SVar10;
  (pSVar12->super_AssignmentPatternExpressionBase).super_Expression.sourceRange.endLoc = SVar11;
  (pSVar12->super_AssignmentPatternExpressionBase).elements_.data_ = ppEVar8;
  (pSVar12->super_AssignmentPatternExpressionBase).elements_.size_ = sVar9;
  (pSVar12->memberSetters).data_ = pMVar2;
  (pSVar12->memberSetters).size_ = sVar3;
  (pSVar12->typeSetters).data_ = pTVar4;
  (pSVar12->typeSetters).size_ = sVar5;
  (pSVar12->indexSetters).data_ = pIVar6;
  (pSVar12->indexSetters).size_ = sVar7;
  pSVar12->defaultSetter = pEVar1;
  return pSVar12;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }